

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boardtest.cc
# Opt level: O3

void __thiscall BoardTest_parseFenRuyLopez_Test::TestBody(BoardTest_parseFenRuyLopez_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer *__ptr;
  BoardTest *this_00;
  char *in_R9;
  Board *this_01;
  initializer_list<std::pair<const_board::Square,_board::Piece>_> __l;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  string local_78;
  undefined8 local_58;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3"
             ,"");
  this_01 = &(this->super_BoardTest).pos;
  local_88[0] = (internal)board::Board::parseFen(this_01,&local_78);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar1) {
    bVar2 = true;
    if ((bool)local_88[0]) goto LAB_0010a431;
  }
  else {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    bVar2 = true;
    if (((byte)local_88[0] & 1) != 0) goto LAB_0010a431;
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_78,local_88,
             (AssertionResult *)
             "pos.parseFen(\"r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3\")",
             "false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sneivandt[P]chess/test/unittest/boardtest.cc"
             ,0x29,local_78._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
  bVar2 = false;
LAB_0010a431:
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (bVar2) {
    local_78.field_2._M_allocated_capacity = 0x20000002e;
    local_78.field_2._8_8_ = 0x800000049;
    local_78._M_dataplus._M_p = (pointer)0x100000037;
    local_78._M_string_length = 0x700000041;
    local_58 = 0x30000003e;
    this_00 = (BoardTest *)&stack0xffffffffffffffb0;
    __l._M_len = 5;
    __l._M_array = (iterator)&local_78;
    std::
    map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
    ::map((map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
           *)this_00,__l,(less<board::Square> *)local_88,(allocator_type *)&local_98);
    test::BoardTest::ASSERT_BOARD
              (this_00,this_01,
               (map<board::Square,_board::Piece,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
                *)&stack0xffffffffffffffb0,BLACK,NO_SQ,3,0xf);
    std::
    _Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
    ::~_Rb_tree((_Rb_tree<board::Square,_std::pair<const_board::Square,_board::Piece>,_std::_Select1st<std::pair<const_board::Square,_board::Piece>_>,_std::less<board::Square>,_std::allocator<std::pair<const_board::Square,_board::Piece>_>_>
                 *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

TEST_F(BoardTest, parseFenRuyLopez)
{
    ASSERT_TRUE(pos.parseFen("r1bqkbnr/pppp1ppp/2n5/1B2p3/4P3/5N2/PPPP1PPP/RNBQK2R b KQkq - 3 3"));

    ASSERT_BOARD(pos,
                 {
                     {board::E4, board::WP},
                     {board::E5, board::BP},
                     {board::F3, board::WN},
                     {board::C6, board::BN},
                     {board::B5, board::WB},
                 },
                 board::BLACK, board::NO_SQ, 3);
}